

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::cmGeneratorTarget(cmGeneratorTarget *this,cmTarget *t,cmLocalGenerator *lg)

{
  _Rb_tree_header *p_Var1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *pcVar3;
  _WordT _Var4;
  _WordT _Var5;
  _WordT _Var6;
  bool bVar7;
  bool bVar8;
  string local_e8;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_c8;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_c0;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_b8;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_b0;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_a8;
  undefined1 local_a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  string local_50;
  
  this->Target = t;
  (this->ObjectDirectory)._M_dataplus._M_p = (pointer)&(this->ObjectDirectory).field_2;
  (this->ObjectDirectory)._M_string_length = 0;
  (this->ObjectDirectory).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SourceDepends)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Objects)._M_t._M_impl.super__Rb_tree_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = &(this->ExportMacro).field_2;
  (this->ExportMacro)._M_dataplus._M_p = (pointer)local_80;
  (this->ExportMacro)._M_string_length = 0;
  (this->ExportMacro).field_2._M_local_buf[0] = '\0';
  this->SourceFileFlagsConstructed = false;
  p_Var1 = &(this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInformation)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
  ;
  p_Var1 = &(this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_c0 = &this->CompileDefinitionsEntries;
  local_c8 = &this->SourceEntries;
  p_Var1 = &(this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SourceEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CompileDefinitionsEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CompileDefinitionsEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CompileDefinitionsEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CompileFeaturesEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CompileFeaturesEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CompileOptionsEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CompileFeaturesEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CompileOptionsEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CompileOptionsEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->IncludeDirectoriesEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->IncludeDirectoriesEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->IncludeDirectoriesEntries).
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UtilityItems)._M_t._M_impl.super__Rb_tree_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined8 *)((long)(this->PolicyMap).Status.super__Base_bitset<4UL>._M_w + 0x16) = 0;
  *(undefined8 *)((long)(this->PolicyMap).Status.super__Base_bitset<4UL>._M_w + 0x1e) = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[2] = 0;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[0] = 0;
  this->LinkImplementationLanguageIsContextDependent = true;
  this->UtilityItemsDone = false;
  p_Var1 = &(this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Makefile = this->Target->Makefile;
  this->LocalGenerator = lg;
  pcVar2 = lg->GlobalGenerator;
  this->GlobalGenerator = pcVar2;
  local_b8 = &this->CompileFeaturesEntries;
  local_b0 = &this->CompileOptionsEntries;
  local_a8 = &this->IncludeDirectoriesEntries;
  (*pcVar2->_vptr_cmGlobalGenerator[0x1f])(pcVar2,this);
  local_e8._0_16_ = cmTarget::GetIncludeDirectoriesEntries_abi_cxx11_(t);
  local_a0._0_16_ = (undefined1  [16])cmTarget::GetIncludeDirectoriesBacktraces(t);
  CreatePropertyGeneratorExpressions
            ((cmStringRange *)&local_e8,(cmBacktraceRange *)local_a0,
             &this->IncludeDirectoriesEntries,false);
  local_e8._0_16_ = cmTarget::GetCompileOptionsEntries_abi_cxx11_(t);
  local_a0._0_16_ = (undefined1  [16])cmTarget::GetCompileOptionsBacktraces(t);
  CreatePropertyGeneratorExpressions
            ((cmStringRange *)&local_e8,(cmBacktraceRange *)local_a0,&this->CompileOptionsEntries,
             false);
  local_e8._0_16_ = cmTarget::GetCompileFeaturesEntries_abi_cxx11_(t);
  local_a0._0_16_ = (undefined1  [16])cmTarget::GetCompileFeaturesBacktraces(t);
  CreatePropertyGeneratorExpressions
            ((cmStringRange *)&local_e8,(cmBacktraceRange *)local_a0,&this->CompileFeaturesEntries,
             false);
  local_e8._0_16_ = cmTarget::GetCompileDefinitionsEntries_abi_cxx11_(t);
  local_a0._0_16_ = (undefined1  [16])cmTarget::GetCompileDefinitionsBacktraces(t);
  CreatePropertyGeneratorExpressions
            ((cmStringRange *)&local_e8,(cmBacktraceRange *)local_a0,local_c0,false);
  local_e8._0_16_ = cmTarget::GetSourceEntries_abi_cxx11_(t);
  local_a0._0_16_ = (undefined1  [16])cmTarget::GetSourceBacktraces(t);
  CreatePropertyGeneratorExpressions
            ((cmStringRange *)&local_e8,(cmBacktraceRange *)local_a0,local_c8,true);
  pcVar3 = this->Makefile;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"WIN32","");
  bVar7 = cmMakefile::IsOn(pcVar3,&local_e8);
  if (!bVar7) {
    pcVar3 = this->Makefile;
    local_a0._0_8_ = (cmListFileBacktrace *)(local_a0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"CYGWIN","");
    bVar8 = cmMakefile::IsOn(pcVar3,(string *)local_a0);
    if (!bVar8) {
      pcVar3 = this->Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MINGW","");
      bVar8 = cmMakefile::IsOn(pcVar3,&local_50);
      this->DLLPlatform = bVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00329567;
    }
  }
  this->DLLPlatform = true;
LAB_00329567:
  if ((!bVar7) &&
     ((cmListFileBacktrace *)local_a0._0_8_ != (cmListFileBacktrace *)(local_a0 + 0x10))) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((cmStringRange *)local_e8._M_dataplus._M_p != (cmStringRange *)&local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  _Var4 = (t->PolicyMap).Status.super__Base_bitset<4UL>._M_w[0];
  _Var5 = (t->PolicyMap).Status.super__Base_bitset<4UL>._M_w[1];
  _Var6 = (t->PolicyMap).Status.super__Base_bitset<4UL>._M_w[3];
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[2] =
       (t->PolicyMap).Status.super__Base_bitset<4UL>._M_w[2];
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[3] = _Var6;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[0] = _Var4;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[1] = _Var5;
  return;
}

Assistant:

cmGeneratorTarget::cmGeneratorTarget(cmTarget* t, cmLocalGenerator* lg)
  : Target(t),
  SourceFileFlagsConstructed(false),
  PolicyWarnedCMP0022(false),
  DebugIncludesDone(false),
  DebugCompileOptionsDone(false),
  DebugCompileFeaturesDone(false),
  DebugCompileDefinitionsDone(false),
  DebugSourcesDone(false),
  LinkImplementationLanguageIsContextDependent(true),
  UtilityItemsDone(false)
{
  this->Makefile = this->Target->GetMakefile();
  this->LocalGenerator = lg;
  this->GlobalGenerator = this->LocalGenerator->GetGlobalGenerator();

  this->GlobalGenerator->ComputeTargetObjectDirectory(this);

  CreatePropertyGeneratorExpressions(
        t->GetIncludeDirectoriesEntries(),
        t->GetIncludeDirectoriesBacktraces(),
        this->IncludeDirectoriesEntries);

  CreatePropertyGeneratorExpressions(
        t->GetCompileOptionsEntries(),
        t->GetCompileOptionsBacktraces(),
        this->CompileOptionsEntries);

  CreatePropertyGeneratorExpressions(
        t->GetCompileFeaturesEntries(),
        t->GetCompileFeaturesBacktraces(),
        this->CompileFeaturesEntries);

  CreatePropertyGeneratorExpressions(
        t->GetCompileDefinitionsEntries(),
        t->GetCompileDefinitionsBacktraces(),
        this->CompileDefinitionsEntries);

  CreatePropertyGeneratorExpressions(
        t->GetSourceEntries(),
        t->GetSourceBacktraces(),
        this->SourceEntries, true);

  this->DLLPlatform = (this->Makefile->IsOn("WIN32") ||
                       this->Makefile->IsOn("CYGWIN") ||
                       this->Makefile->IsOn("MINGW"));

  this->PolicyMap = t->PolicyMap;
}